

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Descriptor **v1;
  Descriptor **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  ExtensionSet *this_00;
  void *default_value;
  bool local_c2;
  LogMessage local_a8;
  Voidify local_91;
  Descriptor *local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LogMessage local_78;
  Voidify local_65 [20];
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  Descriptor *local_38;
  Descriptor *message_type_local;
  FieldDescriptor *pFStack_28;
  CppType cpp_type_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_38 = message_type;
  message_type_local._4_4_ = cpp_type;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd55,"field->is_repeated()");
    local_51 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  CVar2 = FieldDescriptor::cpp_type(pFStack_28);
  absl_log_internal_check_op_result._7_1_ = 0;
  local_c2 = true;
  if (CVar2 != message_type_local._4_4_) {
    CVar2 = FieldDescriptor::cpp_type(pFStack_28);
    local_c2 = CVar2 == CPPTYPE_ENUM && message_type_local._4_4_ == CPPTYPE_INT32;
  }
  if (!local_c2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd58,
               "field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32)"
              );
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [63])
                               "The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [65])
                               "the actual field type (for enums T should be the generated enum ");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [18])"type or int32_t).");
    absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar3);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) == 0) {
    if (local_38 != (Descriptor *)0x0) {
      v1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_38);
      local_90 = FieldDescriptor::message_type(pFStack_28);
      v2 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_90);
      local_88 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                           (v1,v2,"message_type == field->message_type()");
      if (local_88 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_88);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0xd5d,failure_msg);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      local_88 = (Nullable<const_char_*>)0x0;
    }
    bVar1 = FieldDescriptor::is_extension(pFStack_28);
    if (bVar1) {
      this_00 = GetExtensionSet(this,(Message *)field_local);
      number = FieldDescriptor::number(pFStack_28);
      default_value = internal::DefaultRawPtr();
      this_local = (Reflection *)
                   internal::ExtensionSet::GetRawRepeatedField(this_00,number,default_value);
    }
    else {
      this_local = (Reflection *)GetRawNonOneof<char>(this,(Message *)field_local,pFStack_28);
    }
    return this_local;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_78);
}

Assistant:

const void* Reflection::RepeatedFieldData(
    const Message& message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type, const Descriptor* message_type) const {
  ABSL_CHECK(field->is_repeated());
  ABSL_CHECK(field->cpp_type() == cpp_type ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
              cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32_t).";
  if (message_type != nullptr) {
    ABSL_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    return &GetRawNonOneof<char>(message, field);
  }
}